

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi_tests.cpp
# Opt level: O0

void __thiscall
test::spi_test::iu_SPITest_x_iutest_x_FatalFailure2_Test::~iu_SPITest_x_iutest_x_FatalFailure2_Test
          (iu_SPITest_x_iutest_x_FatalFailure2_Test *this)

{
  iu_SPITest_x_iutest_x_FatalFailure2_Test *this_local;
  
  ~iu_SPITest_x_iutest_x_FatalFailure2_Test(this);
  operator_delete(this,0x150);
  return;
}

Assistant:

IUTEST_F(SPITest, FatalFailure2)
{
    int count=0;
#if IUTEST_HAS_EXCEPTIONS
    try {
        FatalFailure2_Sub(count);
    } catch(...) {
    }
#else
    FatalFailure2_Sub(count);
#endif
    IUTEST_ASSERT_EQ(1, count);
}